

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_init::test_method
          (chainstatemanager_snapshot_init *this)

{
  bool bVar1;
  type pCVar2;
  ChainTestingSetup *this_00;
  ChainstateManager *this_01;
  reference ppCVar3;
  Chainstate *this_02;
  long in_FS_OFFSET;
  Chainstate *cs;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2;
  ChainstateManager *chainman_restarted;
  Chainstate *bg_chainstate;
  ChainstateManager *chainman;
  iterator __end2;
  iterator __begin2;
  DisconnectedBlockTransactions unused_pool;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  BlockValidationState unused_state;
  uint256 snapshot_tip_hash;
  path snapshot_chainstate_dir;
  char *in_stack_fffffffffffff588;
  __native_type *in_stack_fffffffffffff590;
  char *in_stack_fffffffffffff598;
  path *in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a8;
  undefined1 fTry;
  int in_stack_fffffffffffff5ac;
  lazy_ostream *in_stack_fffffffffffff5b0;
  DisconnectedBlockTransactions *in_stack_fffffffffffff5b8;
  size_t line_num;
  const_string *in_stack_fffffffffffff5c0;
  Chainstate *file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  ChainstateManager *in_stack_fffffffffffff5d8;
  begin *in_stack_fffffffffffff5e0;
  unit_test_log_t *in_stack_fffffffffffff5e8;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  DisconnectedBlockTransactions *in_stack_fffffffffffff690;
  BlockValidationState *in_stack_fffffffffffff698;
  Chainstate *in_stack_fffffffffffff6a0;
  undefined1 local_810 [88];
  Chainstate **local_7b8;
  Chainstate **local_7b0;
  undefined1 local_790 [168];
  undefined1 local_6e8 [88];
  undefined1 local_690 [16];
  undefined1 local_680 [64];
  const_string local_640 [2];
  lazy_ostream local_620 [2];
  assertion_result local_600 [2];
  const_string local_5c8 [2];
  lazy_ostream local_5a8 [2];
  assertion_result local_588 [2];
  __native_type local_54c;
  undefined1 local_518 [144];
  undefined1 local_488 [88];
  const_string local_430 [2];
  lazy_ostream local_410 [2];
  assertion_result local_3f0 [7];
  __native_type local_344 [2];
  type local_2d0;
  const_string local_2c8 [2];
  lazy_ostream local_2a8 [2];
  assertion_result local_288 [2];
  undefined1 local_250 [16];
  undefined1 local_240 [64];
  const_string local_200 [2];
  lazy_ostream local_1e0 [2];
  assertion_result local_1c0 [2];
  undefined1 local_188 [256];
  __native_type local_88 [2];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,
             (int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),(char *)in_stack_fffffffffffff5b0,
             (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  pCVar2 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffff598);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff598);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)local_188);
  ::node::FindSnapshotChainstateDir((path *)in_stack_fffffffffffff5b8);
  std::optional<fs::path>::operator*((optional<fs::path> *)in_stack_fffffffffffff588);
  fs::path::path((path *)in_stack_fffffffffffff588,(path *)0xcd3362);
  std::optional<fs::path>::~optional((optional<fs::path> *)in_stack_fffffffffffff588);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    fs::exists((path *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff598,
               SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    in_stack_fffffffffffff588 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c0,local_1e0,local_200,0x234,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    ArgsManager::GetDataDirNet((ArgsManager *)&in_stack_fffffffffffff590->__data);
    fs::operator/(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    in_stack_fffffffffffff598 = "gArgs.GetDataDirNet() / \"chainstate_snapshot\"";
    in_stack_fffffffffffff590 = local_88;
    in_stack_fffffffffffff588 = "snapshot_chainstate_dir";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_240,local_250,0x235,1,2,local_30);
    fs::path::~path((path *)in_stack_fffffffffffff588);
    fs::path::~path((path *)in_stack_fffffffffffff588);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    ChainstateManager::IsSnapshotActive
              ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff598,
               SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    in_stack_fffffffffffff588 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_288,local_2a8,local_2c8,0x237,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff588);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff588);
  local_2d0 = pCVar2;
  test_method::anon_class_8_1_3d09f077::operator()
            ((anon_class_8_1_3d09f077 *)in_stack_fffffffffffff5b8);
  ChainstateManager::GetAll(in_stack_fffffffffffff5d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    local_344[0]._4_8_ =
         std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                   ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff588
                   );
    local_344[0].__data.__lock = 2;
    in_stack_fffffffffffff598 = "2";
    in_stack_fffffffffffff590 = local_344;
    in_stack_fffffffffffff588 = "all_chainstates.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              ((undefined1 *)((long)&local_344[0].__data.__list.__prev + 4),
               &local_344[0].__data.__nusers,0x23c,1,2,&local_344[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DisconnectedBlockTransactions::DisconnectedBlockTransactions
            (in_stack_fffffffffffff5b8,(size_t)in_stack_fffffffffffff5b0);
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffff588);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffff5c8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff5c0,
             (char *)in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5ac,SUB41((uint)in_stack_fffffffffffff5a8 >> 0x18,0));
  Chainstate::MempoolMutex((Chainstate *)in_stack_fffffffffffff598);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffff5c8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff5c0,
             (char *)in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5ac,SUB41((uint)in_stack_fffffffffffff5a8 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    Chainstate::DisconnectTip
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff598,
               SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    in_stack_fffffffffffff588 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3f0,local_410,local_430,0x247,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DisconnectedBlockTransactions::clear((DisconnectedBlockTransactions *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff588);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    local_488._4_4_ = CChain::Height((CChain *)in_stack_fffffffffffff588);
    local_488._0_4_ = 0x6d;
    in_stack_fffffffffffff598 = "109";
    in_stack_fffffffffffff590 = (__native_type *)local_488;
    in_stack_fffffffffffff588 = "bg_chainstate.m_chain.Height()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&(((__native_type *)local_488)->__data).__list,
               &(((__native_type *)local_488)->__data).__owner,0x24a,1,2,
               &(((__native_type *)local_488)->__data).__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SnapshotTestSetup::SimulateNodeRestart
            ((SnapshotTestSetup *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
             in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
  boost::unit_test::log::begin::begin
            ((begin *)in_stack_fffffffffffff598,(const_string *)&in_stack_fffffffffffff590->__data,
             (size_t)in_stack_fffffffffffff588);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff5a0,
             (log_level)((ulong)in_stack_fffffffffffff598 >> 0x20));
  this_00 = (ChainTestingSetup *)boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
             (char (*) [46])in_stack_fffffffffffff588);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff598,
             (lazy_ostream *)&in_stack_fffffffffffff590->__data);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]> *)
             in_stack_fffffffffffff588);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)0xcd3e1a);
  ChainTestingSetup::LoadVerifyActivateChainstate(this_00);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff588);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffff5c8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff5c0,
             (char *)in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5ac,SUB41((uint)in_stack_fffffffffffff5a8 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    ChainstateManager::GetAll(in_stack_fffffffffffff5d8);
    local_54c._28_8_ =
         std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                   ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff588
                   );
    local_54c.__data.__lock = 2;
    in_stack_fffffffffffff598 = "2";
    in_stack_fffffffffffff590 = &local_54c;
    in_stack_fffffffffffff588 = "chainman_restarted.GetAll().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_518,(undefined1 *)((long)&local_54c.__data.__list.__next + 4),600,1,2,
               (undefined1 *)((long)&local_54c.__data.__list.__prev + 4));
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff598);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    ChainstateManager::IsSnapshotActive
              ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff598,
               SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    in_stack_fffffffffffff588 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_588,local_5a8,local_5c8,0x259,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    ChainstateManager::IsSnapshotValidated((ChainstateManager *)in_stack_fffffffffffff598);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff598,
               SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    in_stack_fffffffffffff588 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_600,local_620,local_640,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff588);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    ChainstateManager::ActiveTip((ChainstateManager *)in_stack_fffffffffffff588);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff598);
    in_stack_fffffffffffff598 = "snapshot_tip_hash";
    in_stack_fffffffffffff590 = (__native_type *)(local_188 + 0xb8);
    in_stack_fffffffffffff588 = "chainman_restarted.ActiveTip()->GetBlockHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_680,local_690,0x25c,1,2,local_188 + 0x50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    local_6e8._4_4_ =
         ChainstateManager::ActiveHeight((ChainstateManager *)in_stack_fffffffffffff588);
    local_6e8._0_4_ = 0xd2;
    in_stack_fffffffffffff598 = "210";
    in_stack_fffffffffffff590 = (__native_type *)local_6e8;
    in_stack_fffffffffffff588 = "chainman_restarted.ActiveHeight()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&(((__native_type *)local_6e8)->__data).__list,
               &(((__native_type *)local_6e8)->__data).__owner,0x25d,1,2,
               &(((__native_type *)local_6e8)->__data).__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    fTry = (undefined1)((uint)in_stack_fffffffffffff5a8 >> 0x18);
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff588);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
             in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
  boost::unit_test::log::begin::begin
            ((begin *)in_stack_fffffffffffff598,(const_string *)&in_stack_fffffffffffff590->__data,
             (size_t)in_stack_fffffffffffff588);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff5a0,
             (log_level)((ulong)in_stack_fffffffffffff598 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
             (char (*) [72])in_stack_fffffffffffff588);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff598,
             (lazy_ostream *)&in_stack_fffffffffffff590->__data);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[72],_const_char_(&)[72]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[72],_const_char_(&)[72]> *)
             in_stack_fffffffffffff588);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)0xcd464a);
  TestChain100Setup::mineBlocks
            ((TestChain100Setup *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             (int)((ulong)in_stack_fffffffffffff5c8 >> 0x20));
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff588);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff588);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffff5c8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff5c0,
             (char *)in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5ac,(bool)fTry);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
               (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
    this_01 = (ChainstateManager *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
               (char (*) [1])in_stack_fffffffffffff588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
               in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
    local_790._4_4_ =
         ChainstateManager::ActiveHeight((ChainstateManager *)in_stack_fffffffffffff588);
    local_790._0_4_ = 0xdc;
    in_stack_fffffffffffff598 = "220";
    in_stack_fffffffffffff590 = (__native_type *)local_790;
    in_stack_fffffffffffff588 = "chainman_restarted.ActiveHeight()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&(((__native_type *)local_790)->__data).__list,
               &(((__native_type *)local_790)->__data).__owner,0x265,1,2,
               &(((__native_type *)local_790)->__data).__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff588);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetAll(this_01);
  local_7b0 = (Chainstate **)
              std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                        ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                         &in_stack_fffffffffffff590->__data);
  local_7b8 = (Chainstate **)
              std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                        ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                         &in_stack_fffffffffffff590->__data);
  while (bVar1 = __gnu_cxx::
                 operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_fffffffffffff598,
                            (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)&in_stack_fffffffffffff590->__data), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           *)in_stack_fffffffffffff588);
    file = *ppCVar3;
    this_02 = ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff598);
    if (file != this_02) {
      do {
        line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
                   in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)this_02,(const_string *)file,line_num,
                   (const_string *)in_stack_fffffffffffff5b0);
        in_stack_fffffffffffff5b0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)&in_stack_fffffffffffff590->__data,
                   (char (*) [1])in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff598,
                   in_stack_fffffffffffff590->__size,(unsigned_long)in_stack_fffffffffffff588);
        local_810._4_4_ = CChain::Height((CChain *)in_stack_fffffffffffff588);
        local_810._0_4_ = 0x6d;
        in_stack_fffffffffffff598 = "109";
        in_stack_fffffffffffff590 = (__native_type *)local_810;
        in_stack_fffffffffffff588 = "cs->m_chain.Height()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                  (&(((__native_type *)local_810)->__data).__list,
                   &(((__native_type *)local_810)->__data).__owner,0x26b,1,2,
                   &(((__native_type *)local_810)->__data).__count);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff588);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                *)in_stack_fffffffffffff588);
  }
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff598);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff588);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffff588);
  DisconnectedBlockTransactions::~DisconnectedBlockTransactions
            ((DisconnectedBlockTransactions *)in_stack_fffffffffffff588);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff598);
  fs::path::~path((path *)in_stack_fffffffffffff588);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_init, SnapshotTestSetup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& bg_chainstate = chainman.ActiveChainstate();

    this->SetupSnapshot();

    fs::path snapshot_chainstate_dir = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));
    BOOST_CHECK_EQUAL(snapshot_chainstate_dir, gArgs.GetDataDirNet() / "chainstate_snapshot");

    BOOST_CHECK(chainman.IsSnapshotActive());
    const uint256 snapshot_tip_hash = WITH_LOCK(chainman.GetMutex(),
        return chainman.ActiveTip()->GetBlockHash());

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 2);

    // "Rewind" the background chainstate so that its tip is not at the
    // base block of the snapshot - this is so after simulating a node restart,
    // it will initialize instead of attempting to complete validation.
    //
    // Note that this is not a realistic use of DisconnectTip().
    DisconnectedBlockTransactions unused_pool{MAX_DISCONNECTED_TX_POOL_BYTES};
    BlockValidationState unused_state;
    {
        LOCK2(::cs_main, bg_chainstate.MempoolMutex());
        BOOST_CHECK(bg_chainstate.DisconnectTip(unused_state, &unused_pool));
        unused_pool.clear();  // to avoid queuedTx assertion errors on teardown
    }
    BOOST_CHECK_EQUAL(bg_chainstate.m_chain.Height(), 109);

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully cleans up the background-validation
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates.
    this->LoadVerifyActivateChainstate();

    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 2);
        BOOST_CHECK(chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());

        BOOST_CHECK_EQUAL(chainman_restarted.ActiveTip()->GetBlockHash(), snapshot_tip_hash);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the initialized snapshot chainstate");
    mineBlocks(10);
    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);

        // Background chainstate should be unaware of new blocks on the snapshot
        // chainstate.
        for (Chainstate* cs : chainman_restarted.GetAll()) {
            if (cs != &chainman_restarted.ActiveChainstate()) {
                BOOST_CHECK_EQUAL(cs->m_chain.Height(), 109);
            }
        }
    }
}